

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

ProStringList * __thiscall
QMakeEvaluator::values
          (ProStringList *__return_storage_ptr__,QMakeEvaluator *this,ProKey *variableName)

{
  ProString *pPVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  ulong uVar4;
  const_iterator cVar5;
  ulong uVar6;
  _List_node_base *p_Var7;
  char16_t *pcVar8;
  _Base_ptr p_Var9;
  bool bVar10;
  ulong uVar11;
  _List_node_base *p_Var12;
  
  bVar10 = true;
  p_Var12 = (_List_node_base *)&this->m_valuemapStack;
  do {
    do {
      do {
        p_Var12 = p_Var12->_M_prev;
        if (p_Var12[1]._M_next == (_List_node_base *)0x0) {
          p_Var7 = (_List_node_base *)0x0;
          cVar5._M_node = (_Base_ptr)0x0;
        }
        else {
          cVar5 = std::
                  _Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
                  ::find((_Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
                          *)&(p_Var12[1]._M_next)->_M_prev,variableName);
          p_Var7 = p_Var12[1]._M_next;
        }
        p_Var9 = (_Base_ptr)(p_Var7 + 1);
        if (p_Var7 == (_List_node_base *)0x0) {
          p_Var9 = (_Base_ptr)0x0;
        }
        if (cVar5._M_node != p_Var9) {
          pPVar1 = (ProString *)cVar5._M_node[2]._M_right;
          if (pPVar1 != (ProString *)QMakeInternal::statics._608_8_) {
            p_Var2 = cVar5._M_node[2]._M_left;
            (__return_storage_ptr__->super_QList<ProString>).d.d = (Data *)p_Var2;
            (__return_storage_ptr__->super_QList<ProString>).d.ptr = pPVar1;
            (__return_storage_ptr__->super_QList<ProString>).d.size =
                 *(qsizetype *)(cVar5._M_node + 3);
            if (p_Var2 == (_Base_ptr)0x0) {
              return __return_storage_ptr__;
            }
            LOCK();
            p_Var2->_M_color = p_Var2->_M_color + _S_black;
            UNLOCK();
            return __return_storage_ptr__;
          }
          goto LAB_0027e363;
        }
        if (p_Var12 ==
            (this->m_valuemapStack).
            super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
            super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
            ._M_impl._M_node.super__List_node_base._M_next) goto LAB_0027e363;
        bVar3 = !bVar10;
        bVar10 = false;
      } while (bVar3);
      pcVar8 = (variableName->super_ProString).m_string.d.ptr;
      if (pcVar8 == (char16_t *)0x0) {
        pcVar8 = (char16_t *)&QString::_empty;
      }
      uVar6 = (ulong)(variableName->super_ProString).m_length;
      if ((long)uVar6 < 1) goto LAB_0027e363;
      bVar10 = false;
    } while (9 < (ushort)(pcVar8[(variableName->super_ProString).m_offset] + L'￐'));
    uVar4 = 1;
    do {
      uVar11 = uVar4;
      if (uVar6 == uVar11) break;
      uVar4 = uVar11 + 1;
    } while ((ushort)((pcVar8 + (variableName->super_ProString).m_offset)[uVar11] + L'￐') < 10);
    bVar10 = false;
  } while (uVar11 < uVar6);
LAB_0027e363:
  (__return_storage_ptr__->super_QList<ProString>).d.d = (Data *)0x0;
  (__return_storage_ptr__->super_QList<ProString>).d.ptr = (ProString *)0x0;
  (__return_storage_ptr__->super_QList<ProString>).d.size = 0;
  return __return_storage_ptr__;
}

Assistant:

ProStringList QMakeEvaluator::values(const ProKey &variableName) const
{
    ProValueMapStack::const_iterator vmi = m_valuemapStack.cend();
    for (bool first = true; ; first = false) {
        --vmi;
        ProValueMap::ConstIterator it = (*vmi).constFind(variableName);
        if (it != (*vmi).constEnd()) {
            if (it->constBegin() == statics.fakeValue.constBegin())
                break;
            return *it;
        }
        if (vmi == m_valuemapStack.cbegin())
            break;
        if (first && isFunctParam(variableName))
            break;
    }
    return ProStringList();
}